

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O2

char * __thiscall llvm::DataExtractor::getCStr(DataExtractor *this,uint64_t *offset_ptr)

{
  size_t From;
  size_t sVar1;
  char *pcVar2;
  
  From = *offset_ptr;
  pcVar2 = (char *)0x0;
  sVar1 = StringRef::find(&this->Data,'\0',From);
  if (sVar1 != 0xffffffffffffffff) {
    *offset_ptr = sVar1 + 1;
    pcVar2 = (this->Data).Data + From;
  }
  return pcVar2;
}

Assistant:

const char *DataExtractor::getCStr(uint64_t *offset_ptr) const {
  uint64_t offset = *offset_ptr;
  StringRef::size_type pos = Data.find('\0', offset);
  if (pos != StringRef::npos) {
    *offset_ptr = pos + 1;
    return Data.data() + offset;
  }
  return nullptr;
}